

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clufactor.hpp
# Opt level: O0

void __thiscall
soplex::
CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::setupRowVals(CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               *this)

{
  int iVar1;
  int iVar2;
  long lVar3;
  long lVar4;
  long lVar5;
  const_iterator __position;
  bool bVar6;
  long lVar7;
  cpp_dec_float<100U,_int,_void> *in_RDI;
  int *rrperm;
  int *rperm;
  int *rrorig;
  int *rorig;
  int *l_rbeg;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *l_rval;
  int *l_ridx;
  int *beg;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *val;
  int *idx;
  int *l_row;
  int mem;
  int vecs;
  int m;
  int k;
  int j;
  int i;
  cpp_dec_float<100U,_int,_void> *in_stack_fffffffffffffec8;
  cpp_dec_float<100U,_int,_void> *this_00;
  undefined4 in_stack_fffffffffffffef0;
  undefined4 uVar8;
  size_type in_stack_fffffffffffffef8;
  vector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
  *in_stack_ffffffffffffff00;
  undefined4 in_stack_ffffffffffffff08;
  int in_stack_ffffffffffffff0c;
  int **in_stack_ffffffffffffff10;
  undefined4 *local_a8;
  undefined4 *local_a0;
  undefined4 *local_98;
  undefined4 *local_90;
  int *local_88;
  uint *local_60;
  int local_48;
  int local_40;
  uint local_3c;
  
  iVar1 = *(int *)((long)&(((_Vector_impl *)in_RDI[6].data._M_elems)->super__Vector_impl_data).
                          _M_finish + 4);
  lVar3 = *(long *)((long)((_Vector_impl *)in_RDI[6].data._M_elems + 1) + 8);
  local_60 = (uint *)(((_Vector_impl *)in_RDI[6].data._M_elems)->super__Vector_impl_data)._M_start;
  std::
  vector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
  ::data((vector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
          *)0x536d17);
  lVar4 = *(long *)((_Vector_impl *)in_RDI[6].data._M_elems + 1);
  iVar2 = *(int *)(lVar4 + (long)iVar1 * 4);
  bVar6 = std::
          vector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
          ::empty((vector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                   *)in_RDI);
  if (!bVar6) {
    std::
    vector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
    ::clear((vector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
             *)0x536d76);
  }
  lVar5._0_4_ = in_RDI[6].fpclass;
  lVar5._4_4_ = in_RDI[6].prec_elem;
  if (lVar5 != 0) {
    spx_free<int*>((int **)0x536d9a);
  }
  if (*(pointer *)in_RDI[7].data._M_elems != (pointer)0x0) {
    spx_free<int*>((int **)0x536dbe);
  }
  if (*(pointer *)((long)in_RDI[7].data._M_elems + 8) != (pointer)0x0) {
    spx_free<int*>((int **)0x536de2);
  }
  if (*(long *)((long)in_RDI[7].data._M_elems + 0x10) != 0) {
    spx_free<int*>((int **)0x536e09);
  }
  std::
  vector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
  ::reserve(in_stack_ffffffffffffff00,in_stack_fffffffffffffef8);
  this_00 = (cpp_dec_float<100U,_int,_void> *)((_Vector_impl *)in_RDI[6].data._M_elems + 2);
  std::
  vector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
  ::begin((vector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
           *)in_stack_fffffffffffffec8);
  __gnu_cxx::
  __normal_iterator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>const*,std::vector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>,std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>>>>
  ::
  __normal_iterator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>*>
            ((__normal_iterator<const_boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_*,_std::vector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>_>
              *)this_00,
             (__normal_iterator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_*,_std::vector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>_>
              *)in_stack_fffffffffffffec8);
  uVar8 = 0;
  boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::cpp_dec_float<long_long>
            (in_RDI,(long)iVar2,this_00);
  __position._M_current._4_4_ = in_stack_ffffffffffffff0c;
  __position._M_current._0_4_ = in_stack_ffffffffffffff08;
  std::
  vector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
  ::insert(in_stack_ffffffffffffff00,__position,in_stack_fffffffffffffef8,
           (value_type *)CONCAT44(uVar8,in_stack_fffffffffffffef0));
  spx_alloc<int*>(in_stack_ffffffffffffff10,in_stack_ffffffffffffff0c);
  spx_alloc<int*>(in_stack_ffffffffffffff10,in_stack_ffffffffffffff0c);
  spx_alloc<int*>(in_stack_ffffffffffffff10,in_stack_ffffffffffffff0c);
  spx_alloc<int*>(in_stack_ffffffffffffff10,in_stack_ffffffffffffff0c);
  lVar5 = *(long *)&in_RDI[6].fpclass;
  std::
  vector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
  ::data((vector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
          *)0x536f89);
  local_a8 = *(undefined4 **)(in_RDI[5].data._M_elems + 6);
  local_a0 = *(undefined4 **)(in_RDI[7].data._M_elems + 4);
  local_98 = *(undefined4 **)(in_RDI[5].data._M_elems + 4);
  local_90 = *(undefined4 **)(in_RDI[7].data._M_elems + 2);
  local_88 = *(undefined4 **)in_RDI[7].data._M_elems;
  local_3c = (in_RDI->data)._M_elems[1];
  while (local_3c != 0) {
    *local_90 = *local_98;
    *local_a0 = *local_a8;
    *local_88 = 0;
    local_a8 = local_a8 + 1;
    local_a0 = local_a0 + 1;
    local_98 = local_98 + 1;
    local_90 = local_90 + 1;
    local_88 = local_88 + 1;
    local_3c = local_3c - 1;
  }
  *local_88 = 0;
  local_88 = (int *)(*(long *)in_RDI[7].data._M_elems + 4);
  local_3c = iVar2;
  while (local_3c != 0) {
    local_88[(int)*local_60] = local_88[(int)*local_60] + 1;
    local_60 = local_60 + 1;
    local_3c = local_3c + -1;
  }
  local_60 = *(uint **)in_RDI[6].data._M_elems;
  local_48 = 0;
  local_3c = (in_RDI->data)._M_elems[1];
  while (local_3c != 0) {
    iVar2 = *local_88;
    *local_88 = local_48;
    local_48 = iVar2 + local_48;
    local_88 = local_88 + 1;
    local_3c = local_3c - 1;
  }
  lVar7 = *(long *)in_RDI[7].data._M_elems + 4;
  local_40 = 0;
  for (local_3c = 0; (int)local_3c < iVar1; local_3c = local_3c + 1) {
    uVar8 = *(undefined4 *)(lVar3 + (long)(int)local_3c * 4);
    for (; local_40 < *(int *)(lVar4 + (long)(int)(local_3c + 1) * 4); local_40 = local_40 + 1) {
      iVar2 = *(int *)(lVar7 + (long)(int)*local_60 * 4);
      *(int *)(lVar7 + (long)(int)*local_60 * 4) = iVar2 + 1;
      *(undefined4 *)(lVar5 + (long)iVar2 * 4) = uVar8;
      boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator=
                (this_00,in_stack_fffffffffffffec8);
      local_60 = local_60 + 1;
    }
  }
  return;
}

Assistant:

void CLUFactor<R>::setupRowVals()
{
   int   i, j, k, m;
   int   vecs, mem;
   int*  l_row;
   int*  idx;
   R* val;
   int*  beg;
   int*  l_ridx;
   R* l_rval;
   int*  l_rbeg;
   int*  rorig;
   int*  rrorig;
   int*  rperm;
   int*  rrperm;

   vecs  = l.firstUpdate;
   l_row = l.row;
   idx   = l.idx;
   val   = l.val.data();
   beg   = l.start;
   mem   = beg[vecs];

   if(!l.rval.empty())
   {
      l.rval.clear();
   }


   if(l.ridx)
      spx_free(l.ridx);

   if(l.rbeg)
      spx_free(l.rbeg);

   if(l.rorig)
      spx_free(l.rorig);

   if(l.rperm)
      spx_free(l.rperm);

   l.rval.reserve(mem);         // small performance improvement before the insertion
   // Insert mem number of zeros.
   l.rval.insert(l.rval.begin(), mem, 0);

   spx_alloc(l.ridx, mem);

   spx_alloc(l.rbeg, thedim + 1);

   spx_alloc(l.rorig, thedim);

   spx_alloc(l.rperm, thedim);

   l_ridx = l.ridx;

   l_rval = l.rval.data();

   l_rbeg = l.rbeg;

   rorig  = l.rorig;

   rrorig = row.orig;

   rperm  = l.rperm;

   rrperm = row.perm;

   for(i = thedim; i--; *l_rbeg++ = 0)
   {
      *rorig++ = *rrorig++;
      *rperm++ = *rrperm++;
   }

   *l_rbeg = 0;

   l_rbeg = l.rbeg + 1;

   for(i = mem; i--;)
      l_rbeg[*idx++]++;

   idx = l.idx;

   for(m = 0, i = thedim; i--; l_rbeg++)
   {
      j = *l_rbeg;
      *l_rbeg = m;
      m += j;
   }

   assert(m == mem);

   l_rbeg = l.rbeg + 1;

   for(i = j = 0; i < vecs; ++i)
   {
      m = l_row[i];
      assert(idx == &l.idx[l.start[i]]);

      for(; j < beg[i + 1]; j++)
      {
         k = l_rbeg[*idx++]++;
         assert(k < mem);
         l_ridx[k] = m;
         l_rval[k] = *val++;
      }
   }

   assert(l.rbeg[thedim] == mem);

   assert(l.rbeg[0] == 0);
}